

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O2

int blake2b_init(blake2b_state *S,size_t outlen)

{
  int iVar1;
  blake2b_param P;
  blake2b_param local_40;
  
  iVar1 = -1;
  if (S != (blake2b_state *)0x0) {
    if (outlen - 0x41 < 0xffffffffffffffc0) {
      if (S->last_node != '\0') {
        S->f[1] = 0xffffffffffffffff;
      }
      S->f[0] = 0xffffffffffffffff;
      return iVar1;
    }
    local_40.digest_length = (uint8_t)outlen;
    local_40.key_length = '\0';
    local_40.fanout = '\x01';
    local_40.depth = '\x01';
    local_40._4_8_ = 0;
    local_40._12_8_ = 0;
    local_40.reserved[2] = '\0';
    local_40.reserved[3] = '\0';
    local_40.reserved[4] = '\0';
    local_40.reserved[5] = '\0';
    local_40.reserved[6] = '\0';
    local_40.reserved[7] = '\0';
    local_40.reserved[8] = '\0';
    local_40.reserved[9] = '\0';
    local_40.reserved[10] = '\0';
    local_40.reserved[0xb] = '\0';
    local_40.reserved[0xc] = '\0';
    local_40.reserved[0xd] = '\0';
    local_40.salt[0] = '\0';
    local_40.salt[1] = '\0';
    local_40.salt[2] = '\0';
    local_40.salt[3] = '\0';
    local_40.salt[4] = '\0';
    local_40.salt[5] = '\0';
    local_40.salt[6] = '\0';
    local_40.salt[7] = '\0';
    local_40.salt[8] = '\0';
    local_40.salt[9] = '\0';
    local_40.salt[10] = '\0';
    local_40.salt[0xb] = '\0';
    local_40.salt[0xc] = '\0';
    local_40.salt[0xd] = '\0';
    local_40.salt[0xe] = '\0';
    local_40.salt[0xf] = '\0';
    local_40.personal[0] = '\0';
    local_40.personal[1] = '\0';
    local_40.personal[2] = '\0';
    local_40.personal[3] = '\0';
    local_40.personal[4] = '\0';
    local_40.personal[5] = '\0';
    local_40.personal[6] = '\0';
    local_40.personal[7] = '\0';
    local_40.personal[8] = '\0';
    local_40.personal[9] = '\0';
    local_40.personal[10] = '\0';
    local_40.personal[0xb] = '\0';
    local_40.personal[0xc] = '\0';
    local_40.personal[0xd] = '\0';
    local_40.personal[0xe] = '\0';
    local_40.personal[0xf] = '\0';
    iVar1 = blake2b_init_param(S,&local_40);
  }
  return iVar1;
}

Assistant:

int blake2b_init(blake2b_state *S, size_t outlen) {
	blake2b_param P;

	if (S == NULL) {
		return -1;
	}

	if ((outlen == 0) || (outlen > BLAKE2B_OUTBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	/* Setup Parameter Block for unkeyed BLAKE2 */
	P.digest_length = (uint8_t)outlen;
	P.key_length = 0;
	P.fanout = 1;
	P.depth = 1;
	P.leaf_length = 0;
	P.node_offset = 0;
	P.node_depth = 0;
	P.inner_length = 0;
	memset(P.reserved, 0, sizeof(P.reserved));
	memset(P.salt, 0, sizeof(P.salt));
	memset(P.personal, 0, sizeof(P.personal));

	return blake2b_init_param(S, &P);
}